

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_encoder.hpp
# Opt level: O2

void __thiscall
duckdb::RleBpEncoder::WriteMany(RleBpEncoder *this,WriteStream *writer,uint32_t value,idx_t count)

{
  idx_t iVar1;
  uint32_t value_local;
  
  value_local = value;
  if (this->rle_count != 0) {
    WriteValue(this,writer,&value_local);
    count = count - 1;
  }
  if (this->bp_block_count != 0) {
    iVar1 = 1;
    while( true ) {
      if ((iVar1 == 0) || (count == 0)) break;
      WriteValue(this,writer,&value_local);
      iVar1 = this->bp_block_count;
      count = count - 1;
    }
  }
  this->rle_value = value_local;
  this->rle_count = this->rle_count + count;
  return;
}

Assistant:

void WriteMany(WriteStream &writer, uint32_t value, idx_t count) {
		if (rle_count != 0) {
			// If an RLE run is going on, write a single value to either finish it or convert to BP
			WriteValue(writer, value);
			count--;
		}

		if (bp_block_count != 0) {
			// If a BP run is going on, finish it
			while (bp_block_count != 0 && count > 0) {
				WriteValue(writer, value);
				count--;
			}
		}

		// Set remaining as current RLE run
		rle_value = value;
		rle_count += count;
	}